

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall LowDiscrepancy_Sobol_Test::TestBody(LowDiscrepancy_Sobol_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  uint64_t v;
  ulong uVar4;
  uint *puVar5;
  ulong *puVar6;
  ulong uVar7;
  int i;
  ulong uVar8;
  char *pcVar9;
  int dim;
  long lVar10;
  undefined1 *puVar11;
  uint *puVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  AssertionResult gtest_ar;
  Message local_50;
  float local_48 [2];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uVar8 = 0;
  do {
    puVar11 = pbrt::SobolMatrices64;
    puVar12 = &pbrt::SobolMatrices32;
    lVar10 = 0;
    do {
      if (uVar8 == 0) {
        local_50.ss_.ptr_._0_4_ = 0;
        auVar13 = ZEXT816(0) << 0x40;
      }
      else {
        uVar3 = 0;
        puVar5 = puVar12;
        uVar7 = uVar8;
        do {
          if ((uVar7 & 1) != 0) {
            uVar3 = uVar3 ^ *puVar5;
          }
          puVar5 = puVar5 + 1;
          bVar2 = 1 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar2);
        auVar13 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar3);
        uVar4 = 0;
        auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                             ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10)));
        local_50.ss_.ptr_._0_4_ = auVar13._0_4_;
        puVar6 = (ulong *)puVar11;
        uVar7 = uVar8;
        do {
          if ((uVar7 & 1) != 0) {
            uVar4 = uVar4 ^ *puVar6;
          }
          puVar6 = puVar6 + 1;
          bVar2 = 1 < uVar7;
          uVar7 = uVar7 >> 1;
        } while (bVar2);
        auVar1 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar4);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auVar1._0_8_ * 2.220446049250313e-16;
      }
      auVar13 = vminsd_avx(ZEXT816(0x3fefffffffffffff),auVar13);
      local_48[0] = (float)auVar13._0_8_;
      testing::internal::CmpHelperEQ<float,float>
                (local_40,"SobolSampleFloat(i, dim, NoRandomizer())",
                 "(float)SobolSampleDouble(i, dim, NoRandomizer())",(float *)&local_50,local_48);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message(&local_50);
        pcVar9 = "";
        if (local_38.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x98,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_48,&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
        if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar10 = lVar10 + 1;
      puVar12 = puVar12 + 0x34;
      puVar11 = (undefined1 *)((long)puVar11 + 0x1a0);
    } while (lVar10 != 100);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x100);
  uVar8 = 0;
  do {
    if (uVar8 == 0) {
      auVar13 = ZEXT816(0) << 0x40;
    }
    else {
      puVar12 = &pbrt::SobolMatrices32;
      uVar3 = 0;
      uVar7 = uVar8;
      do {
        if ((uVar7 & 1) != 0) {
          uVar3 = uVar3 ^ *puVar12;
        }
        puVar12 = puVar12 + 1;
        bVar2 = 1 < uVar7;
        uVar7 = uVar7 >> 1;
      } while (bVar2);
      auVar13 = vcvtusi2ss_avx512f(in_XMM3,uVar3);
      auVar13 = ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10));
    }
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar13);
    local_50.ss_.ptr_._0_4_ = auVar13._0_4_;
    auVar1._8_8_ = 0x8040201008040201;
    auVar1._0_8_ = 0x8040201008040201;
    auVar13 = vgf2p8affineqb_avx512vl(ZEXT416((uint)uVar8),auVar1,0);
    uVar3 = auVar13._0_4_;
    auVar13 = vcvtusi2ss_avx512f(in_XMM3,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 |
                                         (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
    local_48[0] = auVar13._0_4_ * 2.3283064e-10;
    testing::internal::CmpHelperEQ<float,float>
              (local_40,"SobolSampleFloat(i, 0, NoRandomizer())",
               "ReverseBits32(i) * 2.3283064365386963e-10f",(float *)&local_50,local_48);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      pcVar9 = "";
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x9f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_48,&local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
      if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x2000);
  return;
}

Assistant:

TEST(LowDiscrepancy, Sobol) {
    // Check that float and double variants match (as float values).
    for (int i = 0; i < 256; ++i) {
        for (int dim = 0; dim < 100; ++dim) {
            EXPECT_EQ(SobolSampleFloat(i, dim, NoRandomizer()),
                      (float)SobolSampleDouble(i, dim, NoRandomizer()));
        }
    }

    // Make sure first dimension is the regular base 2 radical inverse
    for (int i = 0; i < 8192; ++i) {
        EXPECT_EQ(SobolSampleFloat(i, 0, NoRandomizer()),
                  ReverseBits32(i) * 2.3283064365386963e-10f);
    }
}